

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O3

void __thiscall
bgui::ImageWindow::visibleImagePart(ImageWindow *this,long *x,long *y,long *w,long *h)

{
  ImageAdapterBase *pIVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  int hh;
  int ww;
  int local_b4;
  double local_b0;
  long *local_a8;
  long *local_a0;
  long *local_98;
  long *local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  int local_64;
  long local_60 [6];
  
  if (this->adapt != (ImageAdapterBase *)0x0) {
    local_a8 = x;
    local_a0 = y;
    local_98 = w;
    local_90 = h;
    BaseWindow::getSize(&this->super_BaseWindow,&local_64,&local_b4);
    lVar8 = 0;
    iVar3 = this->imx;
    if (this->imx < 1) {
      iVar3 = 0;
    }
    local_b0 = this->adapt->scale;
    dVar9 = (double)iVar3 / local_b0;
    iVar3 = this->imy;
    if (this->imy < 1) {
      iVar3 = 0;
    }
    dVar10 = (double)iVar3 / local_b0;
    local_60[5] = 1;
    local_60[3] = (long)dVar9;
    local_60[4] = (long)dVar10;
    iVar3 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
    lVar6 = (long)local_64;
    if (CONCAT44(extraout_var,iVar3) < (long)local_64) {
      lVar6 = CONCAT44(extraout_var,iVar3);
    }
    local_60[0] = (long)((double)lVar6 / local_b0) + (long)dVar9;
    iVar3 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
    lVar6 = (long)local_b4;
    if (CONCAT44(extraout_var_00,iVar3) < (long)local_b4) {
      lVar6 = CONCAT44(extraout_var_00,iVar3);
    }
    local_60[1] = (long)((double)lVar6 / local_b0) + (long)dVar10;
    local_60[2] = 1;
    pIVar1 = this->adapt;
    local_70 = 0;
    local_78 = 0;
    plVar4 = &local_70;
    bVar2 = true;
    do {
      bVar5 = bVar2;
      lVar6 = *plVar4;
      lVar7 = 0;
      do {
        lVar6 = lVar6 + local_60[lVar7 + 3] * (pIVar1->R).v[lVar8][lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      *plVar4 = lVar6;
      lVar8 = 1;
      plVar4 = &local_78;
      bVar2 = false;
    } while (bVar5);
    lVar8 = 0;
    local_80 = 0;
    local_88 = 0;
    plVar4 = &local_80;
    bVar2 = true;
    do {
      bVar5 = bVar2;
      lVar6 = *plVar4;
      lVar7 = 0;
      do {
        lVar6 = lVar6 + local_60[lVar7] * (pIVar1->R).v[lVar8][lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      *plVar4 = lVar6;
      lVar8 = 1;
      plVar4 = &local_88;
      bVar2 = false;
    } while (bVar5);
    lVar8 = local_70;
    if (local_80 < local_70) {
      lVar8 = local_80;
    }
    *local_a8 = lVar8;
    lVar8 = local_78;
    if (local_88 < local_78) {
      lVar8 = local_88;
    }
    *local_a0 = lVar8;
    if (local_80 < local_70) {
      local_80 = local_70;
    }
    if (local_88 < local_78) {
      local_88 = local_78;
    }
    *local_98 = local_80 - *local_a8;
    *local_90 = local_88 - *local_a0;
    return;
  }
  *y = 0;
  *x = 0;
  *h = -1;
  *w = -1;
  return;
}

Assistant:

void ImageWindow::visibleImagePart(long &x, long &y, long &w, long &h)
{
  if (adapt != 0)
  {
    int ww, hh;
    getSize(ww, hh);

    double scale=adapt->getScale();

    gmath::SVector<long, 3> q1, q2;

    q1[0]=static_cast<long>(std::max(imx, 0)/scale);
    q1[1]=static_cast<long>(std::max(imy, 0)/scale);
    q1[2]=1;

    q2[0]=q1[0]+static_cast<long>(std::min(static_cast<long>(ww), adapt->getWidth())/scale);
    q2[1]=q1[1]+static_cast<long>(std::min(static_cast<long>(hh), adapt->getHeight())/scale);
    q2[2]=1;

    const gmath::SVector<long, 2> p1=adapt->getRotationMatrix()*q1;
    const gmath::SVector<long, 2> p2=adapt->getRotationMatrix()*q2;

    x=std::min(p1[0], p2[0]);
    y=std::min(p1[1], p2[1]);
    w=std::max(p1[0], p2[0])-x;
    h=std::max(p1[1], p2[1])-y;
  }
  else
  {
    x=y=0;
    w=h=-1;
  }
}